

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O0

void map2json_storeValues(map2json_tree_t *obj,char *value)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x20) == 2) {
    iVar1 = atoi(in_RSI);
    *(long *)(in_RDI + 0x18) = (long)iVar1;
  }
  else {
    iVar1 = stringlib_isInteger(in_RSI);
    if ((((iVar1 == 0) && (iVar1 = strcmp(in_RSI,"null"), iVar1 != 0)) &&
        (iVar1 = strcmp(in_RSI,"true"), iVar1 != 0)) &&
       ((iVar1 = strcmp(in_RSI,"false"), iVar1 != 0 && (*in_RSI != '\x1b')))) {
      *(undefined4 *)(in_RDI + 0x20) = 3;
      *(char **)(in_RDI + 8) = in_RSI;
    }
    else {
      *(undefined4 *)(in_RDI + 0x20) = 4;
      *(char **)(in_RDI + 8) = in_RSI;
      if (*in_RSI == '\x1b') {
        *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
      }
    }
  }
  return;
}

Assistant:

static void map2json_storeValues(map2json_tree_t *obj, char *value) {
	DEBUG_TEXT("map2json_storeValues([map2json_tree_t *], %s)... ", value);

	if ( obj->type == JSMN_ARRAY ) {
		DEBUG_TEXT("map2json_storeValues([map2json_tree_t *], %s): object is array", value);
		obj->maxArrayId = atoi(value);
		DEBUG_TEXT("map2json_storeValues([map2json_tree_t *], %s)... DONE ", value);
		return;
	}

	if ( stringlib_isInteger(value) || !strcmp(value, "null") || !strcmp(value, "true") || !strcmp(value, "false") || *value == JSON2MAP_PRIMITIVE_PREFIXER ) {
		DEBUG_TEXT("map2json_storeValues([map2json_tree_t *], %s): object is primitive", value);
		obj->type = JSMN_PRIMITIVE;
		obj->value = value;
		if ( *value == JSON2MAP_PRIMITIVE_PREFIXER ) {
			obj->value++;
		}
	} else {
		DEBUG_TEXT("map2json_storeValues([map2json_tree_t *], %s): object is string", value);
		obj->type = JSMN_STRING;
		obj->value = value;
	}

	DEBUG_TEXT("map2json_storeValues([map2json_tree_t *], %s)... DONE", value);
}